

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender __thiscall
fmt::v9::detail::write_int_noinline<char,fmt::v9::appender,unsigned_long>
          (detail *this,appender out,write_int_arg<unsigned_long> arg,
          basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  uint uVar2;
  char *digits;
  appender aVar3;
  byte *pbVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  basic_format_specs<char> *specs_00;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar10;
  char *pcVar11;
  char *pcVar12;
  buffer<char> *buf;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  format_decimal_result<char_*> fVar18;
  write_int_data<char> data;
  char buffer [20];
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_90;
  write_int_data<char> local_88;
  anon_class_40_3_03e05ccd_conflict local_78;
  
  specs_00 = arg._8_8_;
  pVar1 = specs_00->type;
  uVar9 = (uint)arg.abs_value;
  local_90.container = (buffer<char> *)this;
  local_78.write_digits.abs_value =
       (unsigned_long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs_00->field_0xa & 1) != 0) &&
       (bVar17 = write_int_localized<fmt::v9::appender,unsigned_long,char>
                           ((appender *)&local_90,
                            (unsigned_long)
                            out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                            ,uVar9,specs_00,(locale_ref)specs), bVar17)) {
      return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_90.container;
    }
    this = (detail *)local_90.container;
    lVar15 = 0x3f;
    if (((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container | 1) != 0)
    {
      for (; ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container | 1)
             >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    iVar14 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] -
             (uint)((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                   < *(buffer<char> **)
                      (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] * 8));
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char>::write_int_data(&local_88,iVar14,uVar9,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar9;
      local_78.write_digits.num_digits = iVar14;
      aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)this,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (appender)
             aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if (iVar14 < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                  ,0x199,"negative value");
    }
    if ((uVar9 != 0) &&
       (uVar9 = uVar9 & 0xffffff,
       ((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
      do {
        sVar6 = ((buffer<char> *)this)->size_;
        uVar13 = sVar6 + 1;
        if (((buffer<char> *)this)->capacity_ < uVar13) {
          (**((buffer<char> *)this)->_vptr_buffer)(this);
          sVar6 = ((buffer<char> *)this)->size_;
          uVar13 = sVar6 + 1;
        }
        ((buffer<char> *)this)->size_ = uVar13;
        ((buffer<char> *)this)->ptr_[sVar6] = (char)uVar9;
        bVar17 = 0xff < uVar9;
        uVar9 = uVar9 >> 8;
      } while (bVar17);
    }
    fVar18 = format_decimal<char,unsigned_long>
                       ((char *)&local_78,
                        (unsigned_long)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
                        iVar14);
    pcVar5 = fVar18.end;
    break;
  case oct:
    bVar10 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char> *)0x7 < bVar10.container;
      bVar10.container = bVar10.container >> 3;
    } while (bVar17);
    iVar14 = (int)lVar15;
    if (((specs_00->field_0x9 & 0x80) != 0) &&
       (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container !=
        (buffer<char> *)0x0 && specs_00->precision <= iVar14)) {
      uVar8 = 0x3000;
      if (uVar9 == 0) {
        uVar8 = 0x30;
      }
      uVar9 = (uVar8 | uVar9) + 0x1000000;
    }
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char>::write_int_data(&local_88,iVar14,uVar9,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar9;
      local_78.write_digits.num_digits = iVar14;
      aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)this,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (appender)
             aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((uVar9 != 0) && (uVar8 = uVar9 & 0xffffff, (uVar9 & 0xffffff) != 0)) {
      do {
        lVar7 = *(long *)(this + 0x10);
        uVar13 = lVar7 + 1;
        if (*(ulong *)(this + 0x18) < uVar13) {
          (*(code *)**(undefined8 **)this)(this);
          lVar7 = *(long *)(this + 0x10);
          uVar13 = lVar7 + 1;
        }
        *(ulong *)(this + 0x10) = uVar13;
        *(char *)(*(long *)(this + 8) + lVar7) = (char)uVar8;
        bVar17 = 0xff < uVar8;
        uVar8 = uVar8 >> 8;
      } while (bVar17);
    }
    lVar7 = *(long *)(this + 0x10);
    uVar13 = lVar7 + lVar15;
    if (uVar13 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar13;
      if (*(long *)(this + 8) != 0) {
        pbVar4 = (byte *)(lVar15 + *(long *)(this + 8) + lVar7);
        do {
          pbVar4 = pbVar4 + -1;
          *pbVar4 = SUB81(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,0
                         ) & 7 | 0x30;
          bVar17 = (buffer<char> *)0x7 <
                   (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 3
               );
        } while (bVar17);
        return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)this;
      }
    }
    pbVar4 = (byte *)((long)&local_78.prefix + lVar16);
    pcVar5 = (char *)((long)&local_78.prefix + lVar16 + 1);
    do {
      *pbVar4 = SUB81(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,0) &
                7 | 0x30;
      pbVar4 = pbVar4 + -1;
      bVar17 = (buffer<char> *)0x7 <
               (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           (buffer<char> *)
           ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 3);
    } while (bVar17);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar2 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar8 = uVar2 << 8;
      if (uVar9 == 0) {
        uVar8 = uVar2;
      }
      uVar9 = (uVar8 | uVar9) + 0x2000000;
    }
    bVar10 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char> *)0xf < bVar10.container;
      bVar10.container = bVar10.container >> 4;
    } while (bVar17);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      lVar16 = ((ulong)(pVar1 == hex_upper) << 0x20) + lVar15;
      write_int_data<char>::write_int_data(&local_88,(int)lVar15,uVar9,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.write_digits.num_digits = (int)lVar16;
      local_78.write_digits.upper = SUB81((ulong)lVar16 >> 0x20,0);
      local_78.prefix = uVar9;
      aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)this,specs_00,local_88.size,local_88.size,&local_78);
      return (appender)
             aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((uVar9 != 0) && (uVar8 = uVar9 & 0xffffff, (uVar9 & 0xffffff) != 0)) {
      do {
        lVar7 = *(long *)(this + 0x10);
        uVar13 = lVar7 + 1;
        if (*(ulong *)(this + 0x18) < uVar13) {
          (*(code *)**(undefined8 **)this)(this);
          lVar7 = *(long *)(this + 0x10);
          uVar13 = lVar7 + 1;
        }
        *(ulong *)(this + 0x10) = uVar13;
        *(char *)(*(long *)(this + 8) + lVar7) = (char)uVar8;
        bVar17 = 0xff < uVar8;
        uVar8 = uVar8 >> 8;
      } while (bVar17);
    }
    lVar7 = *(long *)(this + 0x10);
    uVar13 = lVar7 + lVar15;
    if (uVar13 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar13;
      if (*(long *)(this + 8) != 0) {
        pcVar5 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar5 = "0123456789ABCDEF";
        }
        pcVar11 = (char *)(*(long *)(this + 8) + lVar7 + lVar15);
        do {
          pcVar11 = pcVar11 + -1;
          *pcVar11 = pcVar5[SUB84(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container,0) & 0xf];
          bVar17 = (buffer<char> *)0xf <
                   (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 4
               );
        } while (bVar17);
        return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)this;
      }
    }
    pcVar11 = (char *)((long)&local_78.prefix + lVar16);
    pcVar5 = (char *)((long)&local_78.prefix + lVar16 + 1);
    pcVar12 = "0123456789abcdef";
    if (pVar1 == hex_upper) {
      pcVar12 = "0123456789ABCDEF";
    }
    do {
      *pcVar11 = pcVar12[SUB84(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container,0) & 0xf];
      pcVar11 = pcVar11 + -1;
      bVar17 = (buffer<char> *)0xf <
               (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           (buffer<char> *)
           ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 4);
    } while (bVar17);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar2 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar8 = uVar2 << 8;
      if (uVar9 == 0) {
        uVar8 = uVar2;
      }
      uVar9 = (uVar8 | uVar9) + 0x2000000;
    }
    bVar10 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char> *)0x1 < bVar10.container;
      bVar10.container = bVar10.container >> 1;
    } while (bVar17);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char>::write_int_data(&local_88,(int)lVar15,uVar9,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar9;
      local_78.write_digits.num_digits = (int)lVar15;
      aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)this,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (appender)
             aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((uVar9 != 0) && (uVar8 = uVar9 & 0xffffff, (uVar9 & 0xffffff) != 0)) {
      do {
        lVar7 = *(long *)(this + 0x10);
        uVar13 = lVar7 + 1;
        if (*(ulong *)(this + 0x18) < uVar13) {
          (*(code *)**(undefined8 **)this)(this);
          lVar7 = *(long *)(this + 0x10);
          uVar13 = lVar7 + 1;
        }
        *(ulong *)(this + 0x10) = uVar13;
        *(char *)(*(long *)(this + 8) + lVar7) = (char)uVar8;
        bVar17 = 0xff < uVar8;
        uVar8 = uVar8 >> 8;
      } while (bVar17);
    }
    lVar7 = *(long *)(this + 0x10);
    uVar13 = lVar7 + lVar15;
    if (uVar13 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar13;
      if (*(long *)(this + 8) != 0) {
        pbVar4 = (byte *)(lVar15 + *(long *)(this + 8) + lVar7);
        do {
          pbVar4 = pbVar4 + -1;
          *pbVar4 = SUB81(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,0
                         ) & 1 | 0x30;
          bVar17 = (buffer<char> *)0x1 <
                   (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 1
               );
        } while (bVar17);
        return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)this;
      }
    }
    pbVar4 = (byte *)((long)&local_78.prefix + lVar16);
    pcVar5 = (char *)((long)&local_78.prefix + lVar16 + 1);
    do {
      *pbVar4 = SUB81(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,0) &
                1 | 0x30;
      pbVar4 = pbVar4 + -1;
      bVar17 = (buffer<char> *)0x1 <
               (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           (buffer<char> *)
           ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 1);
    } while (bVar17);
    break;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_78.prefix =
         (uint)CONCAT21(local_78.prefix._2_2_,
                        (char)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container) << 8;
    aVar3 = write_padded<(fmt::v9::align::type)1,fmt::v9::appender,char,fmt::v9::detail::write_char<char,fmt::v9::appender>(fmt::v9::appender,char,fmt::v9::basic_format_specs<char>const&)::_lambda(fmt::v9::appender)_1_&>
                      ((appender)this,specs_00,1,1,(anon_class_2_2_bf5026b7 *)&local_78);
    return (appender)
           aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  aVar3 = copy_str_noinline<char,char*,fmt::v9::appender>((char *)&local_78,pcVar5,(appender)this);
  return (appender)
         aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}